

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QtPrivate::QColorPicker::resizeEvent(QColorPicker *this,QResizeEvent *ev)

{
  undefined4 *puVar1;
  QWidgetData *pQVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  QRect QVar10;
  QRect QVar11;
  QPixmap local_90 [16];
  undefined8 local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined4 local_58;
  undefined2 uStack_54;
  undefined2 uStack_52;
  undefined6 uStack_50;
  undefined2 uStack_4a;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::resizeEvent((QWidget *)this,ev);
  pQVar2 = (this->super_QFrame).super_QWidget.data;
  iVar8 = (pQVar2->crect).x1.m_i;
  iVar9 = (pQVar2->crect).x2.m_i;
  iVar4 = QFrame::frameWidth(&this->super_QFrame);
  iVar7 = (iVar9 - (iVar8 + iVar4 * 2)) + 1;
  pQVar2 = (this->super_QFrame).super_QWidget.data;
  iVar8 = (pQVar2->crect).y1.m_i;
  iVar9 = (pQVar2->crect).y2.m_i;
  iVar4 = QFrame::frameWidth(&this->super_QFrame);
  iVar9 = (iVar9 - (iVar8 + iVar4 * 2)) + 1;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)&local_78,iVar7,iVar9,Format_RGB32);
  iVar8 = 0;
  puVar6 = (undefined4 *)QImage::scanLine((int)(QImage *)&local_78);
  if (0 < iVar9) {
    do {
      if (0 < iVar7) {
        puVar1 = puVar6 + iVar7;
        iVar4 = 0;
        do {
          uStack_4a = 0xaaaa;
          local_58 = 0;
          uStack_54 = 0xffff;
          uStack_52 = 0;
          uStack_50 = 0;
          QVar10 = QWidget::contentsRect((QWidget *)this);
          QVar11 = QWidget::contentsRect((QWidget *)this);
          QColor::setHsv((int)&local_58,0x168 - iVar4 / (QVar10.x2.m_i.m_i - QVar10.x1.m_i),
                         0xff - (iVar8 * 0xff) / (QVar11.y2.m_i.m_i - QVar11.y1.m_i),200);
          uVar5 = QColor::rgb();
          *puVar6 = uVar5;
          puVar6 = puVar6 + 1;
          iVar4 = iVar4 + 0x168;
        } while (puVar6 < puVar1);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar9);
  }
  QPixmap::fromImage(local_90,(QImage *)&local_78,0);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaa;
  uStack_52 = 0xaaaa;
  uStack_50 = 0xaaaaaaaaaaaa;
  uStack_4a = 0xaaaa;
  QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
  uVar3 = local_80;
  local_58 = 0x83f800;
  uStack_54 = 0;
  uStack_52 = 0;
  local_80 = 0;
  local_48 = *(undefined1 **)&this->field_0x40;
  *(undefined8 *)&this->field_0x40 = uVar3;
  QPixmap::~QPixmap((QPixmap *)&local_58);
  QPixmap::~QPixmap(local_90);
  QImage::~QImage((QImage *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorPicker::resizeEvent(QResizeEvent *ev)
{
    QFrame::resizeEvent(ev);

    int w = width() - frameWidth() * 2;
    int h = height() - frameWidth() * 2;
    QImage img(w, h, QImage::Format_RGB32);
    int x, y;
    uint *pixel = (uint *) img.scanLine(0);
    for (y = 0; y < h; y++) {
        const uint *end = pixel + w;
        x = 0;
        while (pixel < end) {
            QPoint p(x, y);
            QColor c;
            c.setHsv(huePt(p), satPt(p), 200);
            *pixel = c.rgb();
            ++pixel;
            ++x;
        }
    }
    pix = QPixmap::fromImage(img);
}